

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::apply_settings_pack_impl
          (session_impl *this,
          vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *pack)

{
  session_settings *this_00;
  pointer pcVar1;
  pointer psVar2;
  __pthread_internal_list *__n;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  string *psVar9;
  char *pcVar10;
  shared_ptr<libtorrent::aux::torrent> *t;
  pointer psVar11;
  unique_lock<std::mutex> local_70;
  undefined1 local_60 [32];
  undefined8 local_40 [2];
  
  this_00 = &this->m_settings;
  bVar4 = settings_pack::has_val((settings_pack *)pack,5);
  if (bVar4) {
    psVar9 = settings_pack::get_str_abi_cxx11_((settings_pack *)pack,5);
    local_70._M_device = (mutex_type *)local_60;
    pcVar1 = (psVar9->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + psVar9->_M_string_length);
    psVar9 = session_settings::get_str_abi_cxx11_(this_00,5);
    pcVar1 = (psVar9->_M_dataplus)._M_p;
    local_60._16_8_ = local_40;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_60 + 0x10),pcVar1,pcVar1 + psVar9->_M_string_length);
    uVar3 = local_60._16_8_;
    __n = (__pthread_internal_list *)CONCAT71(local_70._9_7_,local_70._M_owns);
    if (__n == (__pthread_internal_list *)local_60._24_8_) {
      if (__n == (__pthread_internal_list *)0x0) {
        bVar4 = false;
      }
      else {
        iVar7 = bcmp(local_70._M_device,(void *)local_60._16_8_,(size_t)__n);
        bVar4 = iVar7 != 0;
      }
    }
    else {
      bVar4 = true;
    }
    if ((undefined8 *)uVar3 != local_40) {
      operator_delete((void *)uVar3,
                      (ulong)((long)&((__pthread_internal_list *)local_40[0])->__prev + 1));
    }
    if (local_70._M_device != (mutex_type *)local_60) {
      operator_delete(local_70._M_device,local_60._0_8_ + 1);
    }
    bVar5 = true;
    if (bVar4) goto LAB_002bc01b;
  }
  bVar4 = settings_pack::has_val((settings_pack *)pack,0x407b);
  if (bVar4) {
    iVar8 = settings_pack::get_int((settings_pack *)pack,0x407b);
    local_70._M_device = &(this->m_settings).m_mutex;
    local_70._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_70);
    local_70._M_owns = true;
    iVar7 = (this->m_settings).m_store.m_ints._M_elems[0x7b];
    ::std::unique_lock<std::mutex>::~unique_lock(&local_70);
    bVar5 = true;
    if (iVar8 != iVar7) goto LAB_002bc01b;
  }
  bVar5 = anon_unknown_119::setting_changed<bool>(pack,this_00,0x8041);
LAB_002bc01b:
  bVar4 = anon_unknown_119::setting_changed<bool>(pack,this_00,0x802a);
  bVar6 = true;
  if (!bVar4) {
    bVar4 = anon_unknown_119::setting_changed<bool>(pack,this_00,0x8022);
    if (!bVar4) {
      bVar6 = anon_unknown_119::setting_changed<bool>(pack,this_00,0x8020);
    }
  }
  pcVar10 = "false";
  if (bVar5 != false) {
    pcVar10 = "true";
  }
  session_log(this,"applying settings pack, reopen_listen_port=%s",pcVar10);
  apply_pack((settings_pack *)pack,this_00,this);
  validate_settings(this);
  (*((this->m_disk_thread)._M_t.
     super___uniq_ptr_impl<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>
     ._M_t.
     super__Tuple_impl<0UL,_libtorrent::disk_interface_*,_std::default_delete<libtorrent::disk_interface>_>
     .super__Head_base<0UL,_libtorrent::disk_interface_*,_false>._M_head_impl)->_vptr_disk_interface
    [0x12])();
  if (bVar5 == false) {
    update_listen_interfaces(this);
  }
  else {
    reopen_listen_sockets(this,true);
  }
  if (bVar6 != false) {
    psVar2 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar11 = (this->m_torrents).m_array.
                   super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar2;
        psVar11 = psVar11 + 1) {
      torrent::update_want_peers
                ((psVar11->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr);
    }
  }
  return;
}

Assistant:

void session_impl::apply_settings_pack_impl(settings_pack const& pack)
	{
		bool const reopen_listen_port
			= setting_changed<std::string>(pack, m_settings, settings_pack::listen_interfaces)
			|| setting_changed<int>(pack, m_settings, settings_pack::proxy_type)
			|| setting_changed<bool>(pack, m_settings, settings_pack::proxy_peer_connections)
#if TORRENT_ABI_VERSION == 1
			|| setting_changed<int>(pack, m_settings, settings_pack::ssl_listen)
#endif
			;

		bool const update_want_peers
			= setting_changed<bool>(pack, m_settings, settings_pack::seeding_outgoing_connections)
			|| setting_changed<bool>(pack, m_settings, settings_pack::enable_outgoing_tcp)
			|| setting_changed<bool>(pack, m_settings, settings_pack::enable_outgoing_utp)
		;

#ifndef TORRENT_DISABLE_LOGGING
		session_log("applying settings pack, reopen_listen_port=%s"
			, reopen_listen_port ? "true" : "false");
#endif

		apply_pack(&pack, m_settings, this);

#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
		validate_settings();
#endif

		m_disk_thread->settings_updated();

		if (!reopen_listen_port)
		{
			// no need to call this if reopen_listen_port is true
			// since the apply_pack will do it
			update_listen_interfaces();
		}
		else
		{
			reopen_listen_sockets();
		}

		if (update_want_peers)
		{
			for (auto const& t : m_torrents)
				t->update_want_peers();
		}
	}